

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_cpc.cpp
# Opt level: O1

void dirSAVECDTCode(path *cdtname)

{
  bool bVar1;
  aint args [3];
  bool opt [3];
  string tfname;
  bool local_54 [12];
  string local_48;
  
  bVar1 = anyComma(&lp);
  if (!bVar1) {
    Error("[SAVECDT] Invalid args. SAVECDT CODE <cdtname>,<name>,<start>,<length>[,<customstartaddress>]"
          ,lp,SUPPRESS);
    return;
  }
  GetDelimitedString_abi_cxx11_(&local_48,&lp);
  bVar1 = anyComma(&lp);
  if (bVar1) {
    local_54[2] = true;
    local_54[0] = false;
    local_54[1] = false;
    getIntArguments<3>(&lp,(aint (*) [3])&stack0xffffffffffffffa0,(bool (*) [3])local_54);
    Error("[SAVECDT] Invalid args. SAVECDT CODE <cdtname>,<name>,<start>,<length>[,<customstartaddress>]"
          ,lp,SUPPRESS);
  }
  else {
    Error("[SAVECDT] Invalid args. SAVECDT CODE <cdtname>,<name>,<start>,<length>[,<customstartaddress>]"
          ,lp,SUPPRESS);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

static void dirSAVECDTCode(const std::filesystem::path & cdtname) {
	constexpr const char* argerr = "[SAVECDT] Invalid args. SAVECDT CODE <cdtname>,<name>,<start>,<length>[,<customstartaddress>]";

	if (!anyComma(lp)) {
		Error(argerr, lp, SUPPRESS); return;
	}

	const std::string tfname = GetDelimitedString(lp);
	if (!anyComma(lp)) {
		Error(argerr, lp, SUPPRESS); return;
	}

	aint args[] = { /*0:start*/ 0, /*1:length*/ 0, /*2:customStart*/ -1 };
	bool opt[] = { false, false, true };
	if (!getIntArguments<3>(lp, args, opt) || args[0] < 0 || args[1] < 1 || 0x10000 <= args[1] || 0x10000 < (args[0]+args[1])) {
		Error(argerr, lp, SUPPRESS); return;
	}

	SaveCDT_Code(cdtname, tfname, args[0], args[1], args[2]);
}